

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O1

GLuint gl4cts::KHRDebug::LabelsTest::createFramebuffer(Functions *gl,RenderContext *rc)

{
  bool bVar1;
  ContextType ctxType;
  GLenum err;
  int line;
  char *msg;
  GLuint id;
  GLint currentFbo;
  GLuint local_20;
  GLuint local_1c;
  
  local_20 = 0;
  ctxType.super_ApiType.m_bits = (ApiType)(*rc->_vptr_RenderContext[2])(rc);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  if (bVar1) {
    (*gl->createFramebuffers)(1,&local_20);
    err = (*gl->getError)();
    msg = "CreateFramebuffers";
    line = 0x38d;
  }
  else {
    (*gl->getIntegerv)(0x8ca6,(GLint *)&local_1c);
    (*gl->genFramebuffers)(1,&local_20);
    (*gl->bindFramebuffer)(0x8ca9,local_20);
    (*gl->bindFramebuffer)(0x8ca9,local_1c);
    err = (*gl->getError)();
    msg = "GenFramebuffers / BindFramebuffer";
    line = 0x396;
  }
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,line);
  return local_20;
}

Assistant:

GLuint LabelsTest::createFramebuffer(const Functions* gl, const glu::RenderContext* rc)
{
	GLuint id = 0;
	if (glu::contextSupports(rc->getType(), glu::ApiType::core(4, 5)))
	{
		gl->createFramebuffers(1, &id);
		GLU_EXPECT_NO_ERROR(gl->getError(), "CreateFramebuffers");
	}
	else
	{
		GLint currentFbo;
		gl->getIntegerv(GL_DRAW_FRAMEBUFFER_BINDING, &currentFbo);
		gl->genFramebuffers(1, &id);
		gl->bindFramebuffer(GL_DRAW_FRAMEBUFFER, id);
		gl->bindFramebuffer(GL_DRAW_FRAMEBUFFER, currentFbo);
		GLU_EXPECT_NO_ERROR(gl->getError(), "GenFramebuffers / BindFramebuffer");
	}

	return id;
}